

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workerThread.cpp
# Opt level: O0

void __thiscall WorkerThread::setAffinity(WorkerThread *this,uint idx)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  native_handle_type __th;
  logic_error *this_00;
  uint in_ESI;
  thread *in_RDI;
  size_t __cpu;
  cpu_set_t cpuset;
  uint in_stack_ffffffffffffff2c;
  string local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  ulong local_98;
  cpu_set_t local_90;
  uint local_c;
  
  local_c = in_ESI;
  memset(&local_90,0,0x80);
  local_98 = (ulong)local_c;
  if (local_c >> 3 < 0x80) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (1L << ((byte)local_c & 0x3f) | local_90.__bits[local_c >> 6]);
    local_90.__bits[local_c >> 6] = (__cpu_mask)__rhs;
  }
  else {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  local_a0 = __rhs;
  __th = std::thread::native_handle(in_RDI);
  iVar1 = pthread_setaffinity_np(__th,0x80,&local_90);
  if (iVar1 != 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(in_stack_ffffffffffffff2c);
    std::operator+((char *)in_RDI,__rhs);
    std::logic_error::logic_error(this_00,local_c0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void WorkerThread::setAffinity (unsigned int idx) {
	cpu_set_t cpuset;
	CPU_ZERO (&cpuset);
	CPU_SET (idx, &cpuset);
	
	if (pthread_setaffinity_np (workerThread.native_handle(), sizeof(cpu_set_t), &cpuset) != 0) {
		throw std::logic_error ("Error setting affinity to processor  " + std::to_string(idx));
	}
}